

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void handle_fp_compare(DisasContext_conflict1 *s,int size,uint rn,uint rm,_Bool cmp_with_zero,
                      _Bool signal_all_nans)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 tcg_rt;
  TCGv_ptr pTVar1;
  TCGv_i64 pTVar2;
  TCGv_i64 tcg_dest;
  TCGv_i32 tcg_dest_00;
  int32_t arg;
  code *pcVar3;
  uintptr_t o_1;
  uintptr_t o;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGv_ptr local_48;
  TCGv_i32 local_40;
  TCGv_i64 local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_rt = tcg_temp_new_i64(tcg_ctx);
  pTVar1 = get_fpstatus_ptr_aarch64(tcg_ctx,size == 1);
  if (size == 3) {
    pTVar2 = read_fp_dreg(s,rn);
    if (cmp_with_zero) {
      tcg_dest = tcg_const_i64_aarch64(tcg_ctx,0);
    }
    else {
      tcg_dest = read_fp_dreg(s,rm);
    }
    local_58 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    local_50 = tcg_dest + (long)&tcg_ctx->pool_cur;
    local_48 = pTVar1 + (long)&tcg_ctx->pool_cur;
    if (signal_all_nans) {
      pcVar3 = helper_vfp_cmped_a64_aarch64;
    }
    else {
      pcVar3 = helper_vfp_cmpd_a64_aarch64;
    }
    tcg_gen_callN_aarch64(tcg_ctx,pcVar3,(TCGTemp *)(tcg_rt + (long)&tcg_ctx->pool_cur),3,&local_58)
    ;
  }
  else {
    tcg_dest_00 = tcg_temp_new_i32(tcg_ctx);
    tcg_dest = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
    local_40 = (TCGv_i32)tcg_dest;
    local_38 = (TCGv_i64)tcg_dest_00;
    read_vec_element_i32(s,tcg_dest_00,rn,0,size);
    if (cmp_with_zero) {
      tcg_gen_movi_i32(tcg_ctx,(TCGv_i32)tcg_dest,arg);
    }
    else {
      read_vec_element_i32(s,(TCGv_i32)tcg_dest,rm,0,size);
    }
    pTVar2 = local_38;
    local_58 = (TCGTemp *)(local_38 + (long)tcg_ctx);
    local_50 = (TCGv_i64)(local_40 + (long)tcg_ctx);
    local_48 = pTVar1 + (long)&tcg_ctx->pool_cur;
    if (size == 2) {
      if (signal_all_nans) {
        pcVar3 = helper_vfp_cmpes_a64_aarch64;
      }
      else {
        pcVar3 = helper_vfp_cmps_a64_aarch64;
      }
    }
    else if (signal_all_nans) {
      pcVar3 = helper_vfp_cmpeh_a64_aarch64;
    }
    else {
      pcVar3 = helper_vfp_cmph_a64_aarch64;
    }
    tcg_gen_callN_aarch64(tcg_ctx,pcVar3,(TCGTemp *)(tcg_rt + (long)&tcg_ctx->pool_cur),3,&local_58)
    ;
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  gen_set_nzcv(tcg_ctx,tcg_rt);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_rt + (long)tcg_ctx));
  return;
}

Assistant:

static void handle_fp_compare(DisasContext *s, int size,
                              unsigned int rn, unsigned int rm,
                              bool cmp_with_zero, bool signal_all_nans)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 tcg_flags = tcg_temp_new_i64(tcg_ctx);
    TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, size == MO_16);

    if (size == MO_64) {
        TCGv_i64 tcg_vn, tcg_vm;

        tcg_vn = read_fp_dreg(s, rn);
        if (cmp_with_zero) {
            tcg_vm = tcg_const_i64(tcg_ctx, 0);
        } else {
            tcg_vm = read_fp_dreg(s, rm);
        }
        if (signal_all_nans) {
            gen_helper_vfp_cmped_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
        } else {
            gen_helper_vfp_cmpd_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
        }
        tcg_temp_free_i64(tcg_ctx, tcg_vn);
        tcg_temp_free_i64(tcg_ctx, tcg_vm);
    } else {
        TCGv_i32 tcg_vn = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_vm = tcg_temp_new_i32(tcg_ctx);

        read_vec_element_i32(s, tcg_vn, rn, 0, size);
        if (cmp_with_zero) {
            tcg_gen_movi_i32(tcg_ctx, tcg_vm, 0);
        } else {
            read_vec_element_i32(s, tcg_vm, rm, 0, size);
        }

        switch (size) {
        case MO_32:
            if (signal_all_nans) {
                gen_helper_vfp_cmpes_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
            } else {
                gen_helper_vfp_cmps_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
            }
            break;
        case MO_16:
            if (signal_all_nans) {
                gen_helper_vfp_cmpeh_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
            } else {
                gen_helper_vfp_cmph_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
            }
            break;
        default:
            g_assert_not_reached();
        }

        tcg_temp_free_i32(tcg_ctx, tcg_vn);
        tcg_temp_free_i32(tcg_ctx, tcg_vm);
    }

    tcg_temp_free_ptr(tcg_ctx, fpst);

    gen_set_nzcv(tcg_ctx, tcg_flags);

    tcg_temp_free_i64(tcg_ctx, tcg_flags);
}